

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:310:32)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:310:32)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  char cVar2;
  bool bVar3;
  runtime_error *this_01;
  string line;
  FileName listFilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258 [32];
  ifstream listFile;
  byte abStack_218 [488];
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  ParseStream::getFileName((FileName *)&listFile,this_00);
  FileName::operator+(&listFilename,path,(FileName *)&listFile);
  std::__cxx11::string::~string((string *)&listFile);
  std::ifstream::ifstream(&listFile);
  std::ifstream::open((char *)&listFile,(_Ios_Openmode)listFilename.filename._M_dataplus._M_p);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    while ((abStack_218[*(long *)(_listFile + -0x18)] & 2) == 0) {
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      line._M_dataplus._M_p = (pointer)&line.field_2;
      std::operator>>((istream *)&listFile,(string *)&line);
      bVar3 = std::operator!=(&line,"");
      if (bVar3) {
        FileName::path((FileName *)local_258,&listFilename);
        FileName::operator+((FileName *)&local_278,(FileName *)local_258,&line);
        std::vector<embree::FileName,_std::allocator<embree::FileName>_>::
        emplace_back<embree::FileName>(&pSVar1->keyFramesFilenames,(FileName *)&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string(local_258);
      }
      std::__cxx11::string::~string((string *)&line);
    }
    std::ifstream::~ifstream(&listFile);
    std::__cxx11::string::~string((string *)&listFilename);
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[3])();
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_278,(string *)&listFilename);
  std::operator+(&line,"cannot open ",&local_278);
  std::runtime_error::runtime_error(this_01,(string *)&line);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }